

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

float sensitivity(baseline *data,base_learner *base,example *ec)

{
  bool bVar1;
  undefined8 uVar2;
  long in_RDX;
  long *in_RDI;
  float fVar3;
  float fVar4;
  float sens;
  float baseline_sens;
  stringstream __msg;
  size_t in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  example *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  example *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_1a8 [16];
  ostream local_198;
  learner<char,_char> *in_stack_ffffffffffffffd0;
  
  if (((*(byte *)((long)in_RDI + 0x1a) & 1) != 0) &&
     (bVar1 = BASELINE::baseline_enabled(in_stack_fffffffffffffe38), !bVar1)) {
    fVar3 = LEARNER::learner<char,_char>::sensitivity
                      ((learner<char,_char> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (example *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       in_stack_fffffffffffffe10);
    return fVar3;
  }
  if ((*(byte *)(in_RDI + 3) & 1) != 0) {
    VW::copy_example_metadata
              (SUB41((uint)in_stack_fffffffffffffe34 >> 0x18,0),in_stack_fffffffffffffe28,
               (example *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    *(undefined4 *)(*in_RDI + 0x6828) = *(undefined4 *)(in_RDX + 0x6828);
    *(undefined4 *)(*in_RDI + 0x6850) = *(undefined4 *)(in_RDX + 0x6850);
    fVar3 = LEARNER::learner<char,_char>::sensitivity
                      ((learner<char,_char> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (example *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       in_stack_fffffffffffffe10);
    LEARNER::as_singleline<char,char>(in_stack_ffffffffffffffd0);
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffe24,fVar3),
               (example *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               in_stack_fffffffffffffe10);
    *(undefined4 *)(in_RDX + 0x6830) = *(undefined4 *)(*in_RDI + 0x6850);
    fVar4 = LEARNER::learner<char,_char>::sensitivity
                      ((learner<char,_char> *)CONCAT44(in_stack_fffffffffffffe24,fVar3),
                       (example *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       in_stack_fffffffffffffe10);
    return fVar3 + fVar4;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"sensitivity for baseline without --global_only not implemented");
  uVar2 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             (string *)in_stack_fffffffffffffe28);
  __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

float sensitivity(baseline& data, base_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
    return base.sensitivity(ec);

  if (!data.global_only)
    THROW("sensitivity for baseline without --global_only not implemented");

  // sensitivity of baseline term
  VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
  data.ec->l.simple.label = ec.l.simple.label;
  data.ec->pred.scalar = ec.pred.scalar;
  // cout << "before base" << endl;
  const float baseline_sens = base.sensitivity(*data.ec);
  // cout << "base sens: " << baseline_sens << endl;

  // sensitivity of residual
  as_singleline(&base)->predict(*data.ec);
  ec.l.simple.initial = data.ec->pred.scalar;
  const float sens = base.sensitivity(ec);
  // cout << " residual sens: " << sens << endl;
  return baseline_sens + sens;
}